

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * luaL_optlstring(lua_State *L,int narg,char *def,size_t *len)

{
  int iVar1;
  undefined8 local_38;
  size_t *len_local;
  char *def_local;
  int narg_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,narg);
  if (iVar1 < 1) {
    L_local = (lua_State *)def;
    if (len != (size_t *)0x0) {
      if (def == (char *)0x0) {
        local_38 = 0;
      }
      else {
        local_38 = strlen(def);
      }
      *len = local_38;
    }
  }
  else {
    L_local = (lua_State *)luaL_checklstring(L,narg,len);
  }
  return (char *)L_local;
}

Assistant:

static const char*luaL_optlstring(lua_State*L,int narg,
const char*def,size_t*len){
if(lua_isnoneornil(L,narg)){
if(len)
*len=(def?strlen(def):0);
return def;
}
else return luaL_checklstring(L,narg,len);
}